

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginComboPreview(void)

{
  float *pfVar1;
  ImRect *pIVar2;
  ImGuiComboPreviewData *clip_rect_min;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  float fVar8;
  float fVar9;
  
  pIVar7 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  if ((((pIVar4->SkipItems == false) &&
       (fVar9 = (pIVar4->ClipRect).Max.y, pfVar1 = &(GImGui->LastItemData).Rect.Min.y,
       *pfVar1 <= fVar9 && fVar9 != *pfVar1)) &&
      (fVar3 = (GImGui->LastItemData).Rect.Max.y, pfVar1 = &(pIVar4->ClipRect).Min.y,
      *pfVar1 <= fVar3 && fVar3 != *pfVar1)) &&
     ((fVar3 = (pIVar4->ClipRect).Max.x, pIVar2 = &(GImGui->LastItemData).Rect,
      (pIVar2->Min).x <= fVar3 && fVar3 != (pIVar2->Min).x &&
      (fVar3 = (GImGui->LastItemData).Rect.Max.x,
      (pIVar4->ClipRect).Min.x <= fVar3 && fVar3 != (pIVar4->ClipRect).Min.x)))) {
    fVar3 = (GImGui->LastItemData).Rect.Min.x;
    fVar8 = (GImGui->ComboPreviewData).PreviewRect.Min.x;
    if (((fVar3 != fVar8) ||
        ((NAN(fVar3) || NAN(fVar8) ||
         (fVar3 = (GImGui->LastItemData).Rect.Min.y,
         pfVar1 = &(GImGui->ComboPreviewData).PreviewRect.Min.y, fVar3 != *pfVar1)))) ||
       (NAN(fVar3) || NAN(*pfVar1))) {
      __assert_fail("g.LastItemData.Rect.Min.x == preview_data->PreviewRect.Min.x && g.LastItemData.Rect.Min.y == preview_data->PreviewRect.Min.y"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_widgets.cpp"
                    ,0x6c2,"bool ImGui::BeginComboPreview()");
    }
    if (((((pIVar4->ClipRect).Min.x <= fVar8) &&
         ((pIVar4->ClipRect).Min.y <= (GImGui->ComboPreviewData).PreviewRect.Min.y)) &&
        ((GImGui->ComboPreviewData).PreviewRect.Max.x <= (pIVar4->ClipRect).Max.x)) &&
       ((GImGui->ComboPreviewData).PreviewRect.Max.y <= fVar9)) {
      clip_rect_min = &GImGui->ComboPreviewData;
      (GImGui->ComboPreviewData).BackupCursorPos = (pIVar4->DC).CursorPos;
      (pIVar7->ComboPreviewData).BackupCursorMaxPos = (pIVar4->DC).CursorMaxPos;
      (pIVar7->ComboPreviewData).BackupCursorPosPrevLine = (pIVar4->DC).CursorPosPrevLine;
      (pIVar7->ComboPreviewData).BackupPrevLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
      (pIVar7->ComboPreviewData).BackupLayout = (pIVar4->DC).LayoutType;
      fVar8 = fVar8 + (pIVar7->Style).FramePadding.x;
      fVar9 = (pIVar7->ComboPreviewData).PreviewRect.Min.y + (pIVar7->Style).FramePadding.y;
      IVar5.y = fVar9;
      IVar5.x = fVar8;
      (pIVar4->DC).CursorPos = IVar5;
      IVar6.y = fVar9;
      IVar6.x = fVar8;
      (pIVar4->DC).CursorMaxPos = IVar6;
      (pIVar4->DC).LayoutType = 0;
      (pIVar4->DC).IsSameLine = false;
      PushClipRect((ImVec2 *)clip_rect_min,&(pIVar7->ComboPreviewData).PreviewRect.Max,true);
      return true;
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginComboPreview()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiComboPreviewData* preview_data = &g.ComboPreviewData;

    if (window->SkipItems || !window->ClipRect.Overlaps(g.LastItemData.Rect)) // FIXME: Because we don't have a ImGuiItemStatusFlags_Visible flag to test last ItemAdd() result
        return false;
    IM_ASSERT(g.LastItemData.Rect.Min.x == preview_data->PreviewRect.Min.x && g.LastItemData.Rect.Min.y == preview_data->PreviewRect.Min.y); // Didn't call after BeginCombo/EndCombo block or forgot to pass ImGuiComboFlags_CustomPreview flag?
    if (!window->ClipRect.Contains(preview_data->PreviewRect)) // Narrower test (optional)
        return false;

    // FIXME: This could be contained in a PushWorkRect() api
    preview_data->BackupCursorPos = window->DC.CursorPos;
    preview_data->BackupCursorMaxPos = window->DC.CursorMaxPos;
    preview_data->BackupCursorPosPrevLine = window->DC.CursorPosPrevLine;
    preview_data->BackupPrevLineTextBaseOffset = window->DC.PrevLineTextBaseOffset;
    preview_data->BackupLayout = window->DC.LayoutType;
    window->DC.CursorPos = preview_data->PreviewRect.Min + g.Style.FramePadding;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.LayoutType = ImGuiLayoutType_Horizontal;
    window->DC.IsSameLine = false;
    PushClipRect(preview_data->PreviewRect.Min, preview_data->PreviewRect.Max, true);

    return true;
}